

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

double __thiscall
Problem_CGBG_FF::GetHouseReward(Problem_CGBG_FF *this,Index fl,size_t nrAgentsPresent)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  
  if (fl != 0) {
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,fl);
    auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,nrAgentsPresent);
    dVar3 = pow(0.7,auVar1._0_8_);
    auVar1._8_8_ = 0x8000000000000000;
    auVar1._0_8_ = 0x8000000000000000;
    auVar2 = vorpd_avx512vl(auVar2,auVar1);
    return dVar3 * auVar2._0_8_;
  }
  return 0.0;
}

Assistant:

double Problem_CGBG_FF::GetHouseReward(Index fl, size_t nrAgentsPresent) const
{
#if 1
    if (fl==0)
        return 0.0;
    
    double base_penalty = fl;
    double discount = pow(0.7, (double)nrAgentsPresent);    
    double reward = -base_penalty * discount;
    //cout << "discount="<<discount<<", reward="<<reward<<endl;
    return reward;
#else
    
    // if there are 2 or more agents present, they can extinguish the
    // fire completely
    switch(nrAgentsPresent)
    {
    case 0:
    case 1:
    {
        double base_penalty = fl;
        return(-1.0 * base_penalty);
    }
    default:
        return(0.0);
    }
#endif
}